

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O3

void __thiscall Fl_Table::_auto_drag_cb(Fl_Table *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fl_Scrollbar *pFVar5;
  double dVar6;
  
  iVar3 = Fl::e_y;
  if (this->_selecting == 4) {
    iVar4 = this->_row_header_w + (this->super_Fl_Group).super_Fl_Widget.x_;
  }
  else {
    iVar4 = Fl::e_x;
    if (this->_selecting == 8) {
      iVar3 = this->_col_header_h + (this->super_Fl_Group).super_Fl_Widget.y_;
    }
  }
  iVar1 = (this->super_Fl_Group).super_Fl_Widget.x_;
  iVar2 = (this->super_Fl_Group).super_Fl_Widget.w_ + iVar1 + -0x14;
  if (iVar2 < iVar4) {
    pFVar5 = this->hscrollbar;
    Fl::e_x = iVar2;
    if (((pFVar5->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) {
      dVar6 = Fl_Valuator::clamp((Fl_Valuator *)pFVar5,
                                 (double)((int)(pFVar5->super_Fl_Slider).super_Fl_Valuator.value_ +
                                         0x1e));
      Fl_Valuator::value((Fl_Valuator *)pFVar5,dVar6);
      pFVar5 = this->hscrollbar;
    }
    Fl_Widget::do_callback
              ((Fl_Widget *)pFVar5,(Fl_Widget *)pFVar5,
               (pFVar5->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.user_data_);
    iVar1 = -0x1e;
LAB_001cbaec:
    this->_dragging_x = iVar1 + Fl::e_x;
  }
  else {
    iVar1 = iVar1 + this->_row_header_w;
    if (iVar4 < iVar1) {
      Fl::e_x = iVar1 + 1;
      pFVar5 = this->hscrollbar;
      if (((pFVar5->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) {
        dVar6 = Fl_Valuator::clamp((Fl_Valuator *)pFVar5,
                                   (double)((int)(pFVar5->super_Fl_Slider).super_Fl_Valuator.value_
                                           + -0x1e));
        Fl_Valuator::value((Fl_Valuator *)pFVar5,dVar6);
        pFVar5 = this->hscrollbar;
      }
      Fl_Widget::do_callback
                ((Fl_Widget *)pFVar5,(Fl_Widget *)pFVar5,
                 (pFVar5->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.user_data_);
      iVar1 = 0x1e;
      goto LAB_001cbaec;
    }
  }
  iVar1 = (this->super_Fl_Group).super_Fl_Widget.y_;
  iVar2 = (this->super_Fl_Group).super_Fl_Widget.h_ + iVar1 + -0x14;
  if (iVar2 < iVar3) {
    pFVar5 = this->vscrollbar;
    Fl::e_y = iVar2;
    if (((pFVar5->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) {
      dVar6 = Fl_Valuator::clamp((Fl_Valuator *)pFVar5,
                                 (double)((int)(pFVar5->super_Fl_Slider).super_Fl_Valuator.value_ +
                                         0x1e));
      Fl_Valuator::value((Fl_Valuator *)pFVar5,dVar6);
      pFVar5 = this->vscrollbar;
    }
    Fl_Widget::do_callback
              ((Fl_Widget *)pFVar5,(Fl_Widget *)pFVar5,
               (pFVar5->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.user_data_);
    iVar1 = -0x1e;
  }
  else {
    iVar1 = iVar1 + this->_col_header_h;
    if (iVar1 <= iVar3) goto LAB_001cbbb6;
    Fl::e_y = iVar1 + 1;
    pFVar5 = this->vscrollbar;
    if (((pFVar5->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) {
      dVar6 = Fl_Valuator::clamp((Fl_Valuator *)pFVar5,
                                 (double)((int)(pFVar5->super_Fl_Slider).super_Fl_Valuator.value_ +
                                         -0x1e));
      Fl_Valuator::value((Fl_Valuator *)pFVar5,dVar6);
      pFVar5 = this->vscrollbar;
    }
    Fl_Widget::do_callback
              ((Fl_Widget *)pFVar5,(Fl_Widget *)pFVar5,
               (pFVar5->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.user_data_);
    iVar1 = 0x1e;
  }
  this->_dragging_y = iVar1 + Fl::e_y;
LAB_001cbbb6:
  this->_auto_drag = 2;
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(this,5);
  this->_auto_drag = 1;
  Fl::e_x = iVar4;
  Fl::e_y = iVar3;
  Fl::check();
  Fl::flush();
  if (((Fl::e_state._3_1_ & 0x7f) != 0) && (this->_auto_drag != 0)) {
    Fl::add_timeout(0.05,_auto_drag_cb2,this);
    return;
  }
  return;
}

Assistant:

void Fl_Table::_auto_drag_cb() {
  int lx = Fl::e_x;
  int ly = Fl::e_y;
  if (_selecting == CONTEXT_COL_HEADER)
  { ly = y() + col_header_height(); }
  else if (_selecting == CONTEXT_ROW_HEADER)
  { lx = x() + row_header_width(); }
  if (lx > x() + w() - 20) {
    Fl::e_x = x() + w() - 20;
    if (hscrollbar->visible())
      ((Fl_Slider*)hscrollbar)->value(hscrollbar->clamp(hscrollbar->value() + 30));
    hscrollbar->do_callback();
    _dragging_x = Fl::e_x - 30;
  }
  else if (lx < (x() + row_header_width())) {
    Fl::e_x = x() + row_header_width() + 1;
    if (hscrollbar->visible()) {
      ((Fl_Slider*)hscrollbar)->value(hscrollbar->clamp(hscrollbar->value() - 30));
    }
    hscrollbar->do_callback();
    _dragging_x = Fl::e_x + 30;
  }
  if (ly > y() + h() - 20) {
    Fl::e_y = y() + h() - 20;
    if (vscrollbar->visible()) {
      ((Fl_Slider*)vscrollbar)->value(vscrollbar->clamp(vscrollbar->value() + 30));
    }
    vscrollbar->do_callback();
    _dragging_y = Fl::e_y - 30;
  }
  else if (ly < (y() + col_header_height())) {
    Fl::e_y = y() + col_header_height() + 1;
    if (vscrollbar->visible()) {
      ((Fl_Slider*)vscrollbar)->value(vscrollbar->clamp(vscrollbar->value() - 30));
    }
    vscrollbar->do_callback();
    _dragging_y = Fl::e_y + 30;
  }
  _auto_drag = 2;
  handle(FL_DRAG);
  _auto_drag = 1;
  Fl::e_x = lx;
  Fl::e_y = ly;
  Fl::check();
  Fl::flush();
  if (Fl::event_buttons() && _auto_drag) {
    Fl::add_timeout(0.05, _auto_drag_cb2, this);
  }
}